

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void setalias(char *name,tagval *v)

{
  bool bVar1;
  ident *id;
  char *s;
  char *fmt;
  char *local_58;
  ident local_50;
  
  local_58 = name;
  id = hashset<ident>::access<char_const*>(&idents,&local_58);
  s = local_58;
  if (id == (ident *)0x0) {
    bVar1 = checknumber(local_58);
    if (!bVar1) {
      local_50.name = newstring(s);
      local_50.type = 4;
      local_50.field_2 = (anon_union_4_3_c060dbb1_for_ident_2)v->type;
      local_50.field_3.code = (uint *)0x0;
      local_50.field_5.stack = (identstack *)0x0;
      local_50.flags = identflags;
      local_50.field_4.val.field_0 = *(identval *)&(v->super_identval).field_0;
      addident(&local_50);
      return;
    }
    fmt = "cannot alias number %s";
  }
  else {
    if (id->type == 4) {
      if (id->index < 0x19) {
        setarg(id,v);
        return;
      }
      setalias(id,v);
      return;
    }
    s = id->name;
    fmt = "cannot redefine builtin %s with an alias";
  }
  debugcode(fmt,s);
  freearg(v);
  return;
}

Assistant:

static void setalias(const char *name, tagval &v)
{
    ident *id = idents.access(name);
    if(id)
    {
        if(id->type == ID_ALIAS)
        {
            if(id->index < MAXARGS) setarg(*id, v); else setalias(*id, v);
        }
        else
        {
            debugcode("cannot redefine builtin %s with an alias", id->name);
            freearg(v);
        }
    }
    else if(checknumber(name))
    {
        debugcode("cannot alias number %s", name);
        freearg(v);
    }
    else
    {
        addident(ident(ID_ALIAS, newstring(name), v, identflags));
    }
}